

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O2

int __thiscall bwtil::cw_bwt::init(cw_bwt *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulint extraout_RAX;
  ulint uVar3;
  ostream *poVar4;
  long lVar5;
  ulint i;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  
  this->number_of_contexts = (this->ca).number_of_k_mers;
  this->sigma = (this->ca).sigma;
  this->TERMINATOR = '\0';
  initStructures(this);
  build(this);
  lVar5 = 0;
  lVar7 = 0;
  lVar8 = 0;
  uVar3 = extraout_RAX;
  for (uVar6 = 0; uVar6 < this->number_of_contexts; uVar6 = uVar6 + 1) {
    uVar3 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::numberOfBits
                      ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
                       (&((this->dynStrings).
                          super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->number_of_internal_nodes +
                       lVar5));
    lVar7 = lVar7 + uVar3;
    uVar3 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::sumOfHeights
                      ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
                       (&((this->dynStrings).
                          super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->number_of_internal_nodes +
                       lVar5));
    lVar8 = lVar8 + uVar3;
    lVar5 = lVar5 + 0x88;
  }
  if (this->verbose != false) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,lVar8);
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,lVar7);
    std::operator<<((ostream *)&std::cout,"\nAverage packed B-tree height is: ");
    poVar4 = std::ostream::_M_insert<double>(auVar1._0_8_ / auVar2._0_8_);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    return (int)poVar4;
  }
  return (int)uVar3;
}

Assistant:

void init(){

		number_of_contexts = ca.numberOfStates();

		sigma = ca.alphabetSize();//this takes into account also the terminator character
		TERMINATOR = 0;

		initStructures();

		build();

		ulint sum_of_heights=0;
		ulint sum_of_lenghts=0;

		for(ulint i=0;i<number_of_contexts;i++){

			sum_of_lenghts += dynStrings[i].numberOfBits();
			sum_of_heights += dynStrings[i].sumOfHeights();

		}

		double avg_height = (double)sum_of_heights/(double)sum_of_lenghts;

		if(verbose) cout << "\nAverage packed B-tree height is: " << avg_height << endl;

	}